

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3TruncateNode(char *aNode,int nNode,Blob *pNew,char *zTerm,int nTerm,sqlite3_int64 *piBlock)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  Blob prev;
  int local_8c;
  Blob local_88;
  undefined1 local_78 [16];
  undefined1 *local_68;
  char *pcStack_60;
  undefined1 *local_58;
  char *pcStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.a = (char *)0x0;
  local_88.n = 0;
  local_88.nAlloc = 0;
  local_8c = 0;
  if (nNode < 1) {
    iVar2 = 0x10b;
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pcStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pcStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    cVar1 = *aNode;
    blobGrowBuffer(pNew,nNode,&local_8c);
    iVar2 = local_8c;
    if (local_8c == 0) {
      pNew->n = 0;
      iVar2 = nodeReaderInit((NodeReader *)local_78,aNode,nNode);
      while ((iVar2 == 0 && ((char *)local_78._0_8_ != (char *)0x0))) {
        if (pNew->n == 0) {
          iVar2 = fts3TermCmp(pcStack_60,(int)local_58,zTerm,nTerm);
          if ((-1 < iVar2) && (cVar1 == '\0' || iVar2 != 0)) {
            fts3StartNode(pNew,(int)*aNode,(sqlite3_int64)local_68);
            *piBlock = (sqlite3_int64)local_68;
            goto LAB_001b9845;
          }
        }
        else {
LAB_001b9845:
          iVar2 = fts3AppendToNode(pNew,&local_88,pcStack_60,(int)local_58,pcStack_50,(int)local_48)
          ;
          if (iVar2 != 0) break;
        }
        iVar2 = nodeReaderNext((NodeReader *)local_78);
      }
      if (pNew->n == 0) {
        fts3StartNode(pNew,(int)*aNode,(sqlite3_int64)local_68);
        *piBlock = (sqlite3_int64)local_68;
      }
      sqlite3_free(pcStack_60);
      sqlite3_free(local_88.a);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts3TruncateNode(
  const char *aNode,              /* Current node image */
  int nNode,                      /* Size of aNode in bytes */
  Blob *pNew,                     /* OUT: Write new node image here */
  const char *zTerm,              /* Omit all terms smaller than this */
  int nTerm,                      /* Size of zTerm in bytes */
  sqlite3_int64 *piBlock          /* OUT: Block number in next layer down */
){
  NodeReader reader;              /* Reader object */
  Blob prev = {0, 0, 0};          /* Previous term written to new node */
  int rc = SQLITE_OK;             /* Return code */
  int bLeaf;                       /* True for a leaf node */

  if( nNode<1 ) return FTS_CORRUPT_VTAB;
  bLeaf = aNode[0]=='\0';

  /* Allocate required output space */
  blobGrowBuffer(pNew, nNode, &rc);
  if( rc!=SQLITE_OK ) return rc;
  pNew->n = 0;

  /* Populate new node buffer */
  for(rc = nodeReaderInit(&reader, aNode, nNode);
      rc==SQLITE_OK && reader.aNode;
      rc = nodeReaderNext(&reader)
  ){
    if( pNew->n==0 ){
      int res = fts3TermCmp(reader.term.a, reader.term.n, zTerm, nTerm);
      if( res<0 || (bLeaf==0 && res==0) ) continue;
      fts3StartNode(pNew, (int)aNode[0], reader.iChild);
      *piBlock = reader.iChild;
    }
    rc = fts3AppendToNode(
        pNew, &prev, reader.term.a, reader.term.n,
        reader.aDoclist, reader.nDoclist
    );
    if( rc!=SQLITE_OK ) break;
  }
  if( pNew->n==0 ){
    fts3StartNode(pNew, (int)aNode[0], reader.iChild);
    *piBlock = reader.iChild;
  }
  assert( pNew->n<=pNew->nAlloc );

  nodeReaderRelease(&reader);
  sqlite3_free(prev.a);
  return rc;
}